

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

void ffesum(unsigned_long sum,int complm,char *ascii)

{
  long in_RDX;
  int in_ESI;
  ulong in_RDI;
  char asc [32];
  int kk;
  int jj;
  int ii;
  int check;
  int ch [4];
  int remainder;
  int quotient;
  int byte;
  unsigned_long value;
  int offset;
  unsigned_long mask [4];
  uint exclude [13];
  undefined1 auStack_d8 [32];
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_a8 [5];
  int local_94;
  uint local_90;
  int local_8c;
  ulong local_88;
  int local_7c;
  ulong local_78 [4];
  uint local_58 [16];
  long local_18;
  int local_c;
  ulong local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memcpy(local_58,&DAT_0026fe10,0x34);
  local_78[0] = 0xff000000;
  local_78[1] = 0xff0000;
  local_78[2] = 0xff00;
  local_78[3] = 0xff;
  local_7c = 0x30;
  if (local_c == 0) {
    local_88 = local_8;
  }
  else {
    local_88 = 0xffffffff - local_8;
  }
  for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
    local_8c = (int)((local_88 & local_78[local_b0]) >> (0x18U - (char)(local_b0 << 3) & 0x3f));
    local_90 = local_8c / 4 + local_7c;
    local_94 = local_8c % 4;
    for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
      local_a8[local_b4] = local_90;
    }
    local_a8[0] = local_94 + local_a8[0];
    local_ac = 1;
    while (local_ac != 0) {
      local_ac = 0;
      for (local_b8 = 0; local_b8 < 0xd; local_b8 = local_b8 + 1) {
        for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 2) {
          if (((local_a8[local_b4] & 0xff) == local_58[local_b8]) ||
             ((local_a8[local_b4 + 1] & 0xff) == local_58[local_b8])) {
            local_a8[local_b4] = local_a8[local_b4] + 1;
            local_a8[local_b4 + 1] = local_a8[local_b4 + 1] - 1;
            local_ac = local_ac + 1;
          }
        }
      }
    }
    for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
      auStack_d8[local_b4 * 4 + local_b0] = (char)local_a8[local_b4];
    }
  }
  for (local_b0 = 0; local_b0 < 0x10; local_b0 = local_b0 + 1) {
    *(undefined1 *)(local_18 + local_b0) = auStack_d8[(local_b0 + 0xf) % 0x10];
  }
  *(undefined1 *)(local_18 + 0x10) = 0;
  return;
}

Assistant:

void ffesum(unsigned long sum,  /* I - accumulated checksum                */
           int complm,          /* I - = 1 to encode complement of the sum */
           char *ascii)         /* O - 16-char ASCII encoded checksum      */
/*
    encode the 32 bit checksum by converting every 
    2 bits of each byte into an ASCII character (32 bit word encoded 
    as 16 character string).   Only ASCII letters and digits are used
    to encode the values (no ASCII punctuation characters).

    If complm=TRUE, then the complement of the sum will be encoded.

    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,
    published in the Astronomical Society of the Pacific Conference Series.
*/
{
    unsigned int exclude[13] = { 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f, 0x40,
                                       0x5b, 0x5c, 0x5d, 0x5e, 0x5f, 0x60 };
    unsigned long mask[4] = { 0xff000000, 0xff0000, 0xff00, 0xff  };

    int offset = 0x30;     /* ASCII 0 (zero) */

    unsigned long value;
    int byte, quotient, remainder, ch[4], check, ii, jj, kk;
    char asc[32];

    if (complm)
        value = 0xFFFFFFFF - sum;   /* complement each bit of the value */
    else
        value = sum;

    for (ii = 0; ii < 4; ii++)
    {
        byte = (value & mask[ii]) >> (24 - (8 * ii));
        quotient = byte / 4 + offset;
        remainder = byte % 4;
        for (jj = 0; jj < 4; jj++)
            ch[jj] = quotient;

        ch[0] += remainder;

        for (check = 1; check;)   /* avoid ASCII  punctuation */
            for (check = 0, kk = 0; kk < 13; kk++)
                for (jj = 0; jj < 4; jj += 2)
                    if ((unsigned char) ch[jj] == exclude[kk] ||
                        (unsigned char) ch[jj+1] == exclude[kk])
                    {
                        ch[jj]++;
                        ch[jj+1]--;
                        check++;
                    }

        for (jj = 0; jj < 4; jj++)        /* assign the bytes */
            asc[4*jj+ii] = ch[jj];
    }

    for (ii = 0; ii < 16; ii++)       /* shift the bytes 1 to the right */
        ascii[ii] = asc[(ii+15)%16];

    ascii[16] = '\0';
}